

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_object.cpp
# Opt level: O0

void graphics_repaint(Am_Slot first_invalidated)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Ptr ptr;
  Am_State_Store *this;
  Am_State_Store *state;
  undefined1 local_40 [8];
  Am_Value value;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object self;
  Am_Slot first_invalidated_local;
  
  self.data = (Am_Object_Data *)first_invalidated.data;
  Am_Slot::Get_Owner((Am_Slot *)&local_20);
  Am_Object::Am_Object(&local_18,&local_20);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_20);
  Am_Value::Am_Value((Am_Value *)local_40);
  in_value = Am_Object::Peek(&local_18,0x7d8,0);
  Am_Value::operator=((Am_Value *)local_40,in_value);
  bVar1 = Am_Value::Exists((Am_Value *)local_40);
  if (bVar1) {
    ptr = Am_Value::operator_cast_to_void_((Am_Value *)local_40);
    this = Am_State_Store::Narrow(ptr);
    if (this != (Am_State_Store *)0x0) {
      Am_State_Store::Add(this,false);
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_40);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

void
graphics_repaint(Am_Slot first_invalidated)
{
  Am_Object self = first_invalidated.Get_Owner();
  Am_Value value;
  value = self.Peek(Am_PREV_STATE);
  if (!value.Exists())
    return;
  Am_State_Store *state = Am_State_Store::Narrow(value);
  if (state)
    state->Add(false);
}